

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O3

int QuickSelect(int *arr,int left,int right,int k)

{
  int iVar1;
  
  if (left < right) {
    do {
      while (iVar1 = partition(arr,left,right,(right + left) / 2), iVar1 <= k) {
        left = iVar1;
        if ((k <= iVar1) || (left = iVar1 + 1, right <= left)) goto LAB_0010b7fa;
      }
      right = iVar1 + -1;
    } while (left < right);
  }
LAB_0010b7fa:
  return arr[left];
}

Assistant:

int QuickSelect(int arr[], int left, int right, int k)
{
	int r, p;
	if (right<=left) {
		return arr[left];
	}
	else {
		p = (right + left) / 2;
		r = partition(arr, left, right, p);
		if (k < r) {
			return QuickSelect(arr, left, r - 1, k);
		}
		if (k > r) {
			return QuickSelect(arr, r + 1, right, k);
		}
		return arr[r];
	}
}